

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O0

void __thiscall skiwi::anon_unknown_23::make_port3_test::test(make_port3_test *this)

{
  allocator<char> local_1189;
  string local_1188;
  string local_1168;
  allocator<char> local_1141;
  string local_1140;
  string local_1120;
  allocator<char> local_10f9;
  string local_10f8;
  string local_10d8;
  allocator<char> local_10b1;
  string local_10b0;
  string local_1090;
  allocator<char> local_1069;
  string local_1068;
  string local_1048;
  allocator<char> local_1021;
  string local_1020;
  string local_1000;
  allocator<char> local_fd9;
  string local_fd8;
  string local_fb8;
  allocator<char> local_f91;
  string local_f90;
  string local_f70;
  allocator<char> local_f49;
  string local_f48;
  string local_f28;
  allocator<char> local_f01;
  string local_f00;
  string local_ee0;
  allocator<char> local_eb9;
  string local_eb8;
  string local_e98;
  allocator<char> local_e71;
  string local_e70;
  string local_e50;
  allocator<char> local_e29;
  string local_e28;
  string local_e08;
  allocator<char> local_de1;
  string local_de0;
  string local_dc0;
  allocator<char> local_d99;
  string local_d98;
  string local_d78;
  allocator<char> local_d51;
  string local_d50;
  string local_d30;
  allocator<char> local_d09;
  string local_d08;
  string local_ce8;
  allocator<char> local_cc1;
  string local_cc0;
  string local_ca0;
  allocator<char> local_c79;
  string local_c78;
  string local_c58;
  allocator<char> local_c31;
  string local_c30;
  string local_c10;
  allocator<char> local_be9;
  string local_be8;
  string local_bc8;
  allocator<char> local_ba1;
  string local_ba0;
  string local_b80;
  allocator<char> local_b59;
  string local_b58;
  string local_b38;
  allocator<char> local_b11;
  string local_b10;
  string local_af0;
  allocator<char> local_ac9;
  string local_ac8;
  string local_aa8;
  allocator<char> local_a81;
  string local_a80;
  string local_a60;
  allocator<char> local_a39;
  string local_a38;
  string local_a18;
  allocator<char> local_9f1;
  string local_9f0;
  string local_9d0;
  allocator<char> local_9a9;
  string local_9a8;
  string local_988;
  allocator<char> local_961;
  string local_960;
  string local_940;
  allocator<char> local_919;
  string local_918;
  string local_8f8;
  allocator<char> local_8d1;
  string local_8d0;
  string local_8b0;
  allocator<char> local_889;
  string local_888;
  string local_868;
  allocator<char> local_841;
  string local_840;
  string local_820;
  allocator<char> local_7f9;
  string local_7f8;
  string local_7d8;
  allocator<char> local_7b1;
  string local_7b0;
  string local_790;
  allocator<char> local_769;
  string local_768;
  string local_748;
  allocator<char> local_721;
  string local_720;
  string local_700;
  allocator<char> local_6d9;
  string local_6d8;
  string local_6b8;
  allocator<char> local_691;
  string local_690;
  string local_670;
  allocator<char> local_649;
  string local_648;
  string local_628;
  allocator<char> local_601;
  string local_600;
  string local_5e0;
  allocator<char> local_5b9;
  string local_5b8;
  string local_598;
  allocator<char> local_571;
  string local_570;
  string local_550;
  allocator<char> local_529;
  string local_528;
  string local_508;
  allocator<char> local_4e1;
  string local_4e0;
  string local_4c0;
  allocator<char> local_499;
  string local_498;
  string local_478;
  allocator<char> local_451;
  string local_450;
  string local_430;
  allocator<char> local_409;
  string local_408;
  string local_3e8;
  allocator<char> local_3c1;
  string local_3c0;
  string local_3a0;
  allocator<char> local_379;
  string local_378;
  string local_358;
  allocator<char> local_331;
  string local_330;
  string local_310;
  allocator<char> local_2e9;
  string local_2e8;
  string local_2c8;
  allocator<char> local_2a1;
  string local_2a0;
  string local_280;
  allocator<char> local_259;
  string local_258;
  string local_238;
  allocator<char> local_211;
  string local_210;
  string local_1f0;
  allocator<char> local_1c9;
  string local_1c8;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  string local_160;
  allocator<char> local_139;
  string local_138;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  string local_88;
  allocator<char> local_51;
  string local_50;
  string local_30;
  make_port3_test *local_10;
  make_port3_test *this_local;
  
  local_10 = this;
  compile_fixture::build_libs(&this->super_compile_fixture);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"(port? standard-input-port)",&local_51);
  compile_fixture::run(&local_30,&this->super_compile_fixture,&local_50,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf58,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"(input-port? standard-input-port)",&local_a9);
  compile_fixture::run(&local_88,&this->super_compile_fixture,&local_a8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_88,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf59,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"(output-port? standard-input-port)",&local_f1);
  compile_fixture::run(&local_d0,&this->super_compile_fixture,&local_f0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf5a,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"(port? standard-output-port)",&local_139);
  compile_fixture::run(&local_118,&this->super_compile_fixture,&local_138,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_118,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf5b,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,"(input-port? standard-output-port)",&local_181);
  compile_fixture::run(&local_160,&this->super_compile_fixture,&local_180,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_160,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf5c,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c8,"(output-port? standard-output-port)",&local_1c9);
  compile_fixture::run(&local_1a8,&this->super_compile_fixture,&local_1c8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf5d,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"(port? standard-error-port)",&local_211);
  compile_fixture::run(&local_1f0,&this->super_compile_fixture,&local_210,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_1f0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf5e,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator(&local_211);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"(input-port? standard-error-port)",&local_259);
  compile_fixture::run(&local_238,&this->super_compile_fixture,&local_258,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_238,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf5f,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator(&local_259);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"(output-port? standard-error-port)",&local_2a1);
  compile_fixture::run(&local_280,&this->super_compile_fixture,&local_2a0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_280,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf60,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e8,
             "(define alternative-output-port (make-port #f \"altout\" 1 (make-string 1024) 0 1024))"
             ,&local_2e9);
  compile_fixture::run(&local_2c8,&this->super_compile_fixture,&local_2e8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("<port>: \"altout\"",&local_2c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf62,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_330,"(current-output-port)",&local_331);
  compile_fixture::run(&local_310,&this->super_compile_fixture,&local_330,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("<port>: \"stdout\"",&local_310,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf64,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_330);
  std::allocator<char>::~allocator(&local_331);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_378,"(current-output-port alternative-output-port)",&local_379);
  compile_fixture::run(&local_358,&this->super_compile_fixture,&local_378,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("<port>: \"altout\"",&local_358,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf65,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_378);
  std::allocator<char>::~allocator(&local_379);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c0,"(current-output-port)",&local_3c1);
  compile_fixture::run(&local_3a0,&this->super_compile_fixture,&local_3c0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("<port>: \"altout\"",&local_3a0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf66,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::allocator<char>::~allocator(&local_3c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_408,"(current-input-port)",&local_409);
  compile_fixture::run(&local_3e8,&this->super_compile_fixture,&local_408,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("<port>: \"stdin\"",&local_3e8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf67,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_408);
  std::allocator<char>::~allocator(&local_409);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_450,"(current-error-port)",&local_451);
  compile_fixture::run(&local_430,&this->super_compile_fixture,&local_450,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("<port>: \"stderr\"",&local_430,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf68,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_450);
  std::allocator<char>::~allocator(&local_451);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_498,
             "(write-char #\\f)(write-char #\\l)(write-char #\\u)(write-char #\\s)(write-char #\\h)(write-char #\\010)"
             ,&local_499);
  compile_fixture::run(&local_478,&this->super_compile_fixture,&local_498,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("",&local_478,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf6a,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_478);
  std::__cxx11::string::~string((string *)&local_498);
  std::allocator<char>::~allocator(&local_499);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4e0,"(flush-output-port)",&local_4e1);
  compile_fixture::run(&local_4c0,&this->super_compile_fixture,&local_4e0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("",&local_4c0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf6b,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_4c0);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::allocator<char>::~allocator(&local_4e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_528,"(open-file \"out.txt\" #f)",&local_529);
  compile_fixture::run(&local_508,&this->super_compile_fixture,&local_528,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_508,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf6d,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_508);
  std::__cxx11::string::~string((string *)&local_528);
  std::allocator<char>::~allocator(&local_529);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_570,"(close-file 3)",&local_571);
  compile_fixture::run(&local_550,&this->super_compile_fixture,&local_570,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("0",&local_550,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf6e,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_550);
  std::__cxx11::string::~string((string *)&local_570);
  std::allocator<char>::~allocator(&local_571);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5b8,"(define my_file (open-output-file \"out.txt\"))",&local_5b9);
  compile_fixture::run(&local_598,&this->super_compile_fixture,&local_5b8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("<port>: \"out.txt\"",&local_598,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf70,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_598);
  std::__cxx11::string::~string((string *)&local_5b8);
  std::allocator<char>::~allocator(&local_5b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_600,"(%slot-ref my_file 2)",&local_601);
  compile_fixture::run(&local_5e0,&this->super_compile_fixture,&local_600,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_5e0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf71,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_5e0);
  std::__cxx11::string::~string((string *)&local_600);
  std::allocator<char>::~allocator(&local_601);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_648,"(write-char #\\o my_file)",&local_649);
  compile_fixture::run(&local_628,&this->super_compile_fixture,&local_648,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("",&local_628,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf72,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_628);
  std::__cxx11::string::~string((string *)&local_648);
  std::allocator<char>::~allocator(&local_649);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_690,"(write-char #\\u my_file)",&local_691);
  compile_fixture::run(&local_670,&this->super_compile_fixture,&local_690,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("",&local_670,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf73,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_670);
  std::__cxx11::string::~string((string *)&local_690);
  std::allocator<char>::~allocator(&local_691);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6d8,"(write-char #\\t my_file)",&local_6d9);
  compile_fixture::run(&local_6b8,&this->super_compile_fixture,&local_6d8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("",&local_6b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf74,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_6b8);
  std::__cxx11::string::~string((string *)&local_6d8);
  std::allocator<char>::~allocator(&local_6d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_720,"(write-char #\\p my_file)",&local_721);
  compile_fixture::run(&local_700,&this->super_compile_fixture,&local_720,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("",&local_700,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf75,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_700);
  std::__cxx11::string::~string((string *)&local_720);
  std::allocator<char>::~allocator(&local_721);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_768,"(write-char #\\u my_file)",&local_769);
  compile_fixture::run(&local_748,&this->super_compile_fixture,&local_768,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("",&local_748,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf76,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_748);
  std::__cxx11::string::~string((string *)&local_768);
  std::allocator<char>::~allocator(&local_769);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7b0,"(write-char #\\t my_file)",&local_7b1);
  compile_fixture::run(&local_790,&this->super_compile_fixture,&local_7b0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("",&local_790,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf77,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_790);
  std::__cxx11::string::~string((string *)&local_7b0);
  std::allocator<char>::~allocator(&local_7b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7f8,"(close-output-port my_file)",&local_7f9);
  compile_fixture::run(&local_7d8,&this->super_compile_fixture,&local_7f8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("0",&local_7d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf78,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_7d8);
  std::__cxx11::string::~string((string *)&local_7f8);
  std::allocator<char>::~allocator(&local_7f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_840,"(close-output-port my_file)",&local_841);
  compile_fixture::run(&local_820,&this->super_compile_fixture,&local_840,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("-1",&local_820,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf79,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_820);
  std::__cxx11::string::~string((string *)&local_840);
  std::allocator<char>::~allocator(&local_841);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_888,"(define my_file (open-input-file \"out.txt\"))",&local_889);
  compile_fixture::run(&local_868,&this->super_compile_fixture,&local_888,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("<port>: \"out.txt\"",&local_868,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf7b,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_868);
  std::__cxx11::string::~string((string *)&local_888);
  std::allocator<char>::~allocator(&local_889);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8d0,"(input-port? my_file)",&local_8d1);
  compile_fixture::run(&local_8b0,&this->super_compile_fixture,&local_8d0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_8b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf7c,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_8b0);
  std::__cxx11::string::~string((string *)&local_8d0);
  std::allocator<char>::~allocator(&local_8d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_918,"(read-char my_file)",&local_919);
  compile_fixture::run(&local_8f8,&this->super_compile_fixture,&local_918,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#\\o",&local_8f8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf7d,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_8f8);
  std::__cxx11::string::~string((string *)&local_918);
  std::allocator<char>::~allocator(&local_919);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_960,"(read-char my_file)",&local_961);
  compile_fixture::run(&local_940,&this->super_compile_fixture,&local_960,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#\\u",&local_940,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf7e,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_940);
  std::__cxx11::string::~string((string *)&local_960);
  std::allocator<char>::~allocator(&local_961);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9a8,"(read-char my_file)",&local_9a9);
  compile_fixture::run(&local_988,&this->super_compile_fixture,&local_9a8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#\\t",&local_988,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf7f,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_988);
  std::__cxx11::string::~string((string *)&local_9a8);
  std::allocator<char>::~allocator(&local_9a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9f0,"(read-char my_file)",&local_9f1);
  compile_fixture::run(&local_9d0,&this->super_compile_fixture,&local_9f0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#\\p",&local_9d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf80,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_9d0);
  std::__cxx11::string::~string((string *)&local_9f0);
  std::allocator<char>::~allocator(&local_9f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a38,"(read-char my_file)",&local_a39);
  compile_fixture::run(&local_a18,&this->super_compile_fixture,&local_a38,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#\\u",&local_a18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf81,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_a18);
  std::__cxx11::string::~string((string *)&local_a38);
  std::allocator<char>::~allocator(&local_a39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a80,"(read-char my_file)",&local_a81);
  compile_fixture::run(&local_a60,&this->super_compile_fixture,&local_a80,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#\\t",&local_a60,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf82,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_a60);
  std::__cxx11::string::~string((string *)&local_a80);
  std::allocator<char>::~allocator(&local_a81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ac8,"(read-char my_file)",&local_ac9);
  compile_fixture::run(&local_aa8,&this->super_compile_fixture,&local_ac8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#eof",&local_aa8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf83,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_aa8);
  std::__cxx11::string::~string((string *)&local_ac8);
  std::allocator<char>::~allocator(&local_ac9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b10,"(read-char my_file)",&local_b11);
  compile_fixture::run(&local_af0,&this->super_compile_fixture,&local_b10,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#eof",&local_af0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf84,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_af0);
  std::__cxx11::string::~string((string *)&local_b10);
  std::allocator<char>::~allocator(&local_b11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b58,"(close-input-port my_file)",&local_b59);
  compile_fixture::run(&local_b38,&this->super_compile_fixture,&local_b58,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("0",&local_b38,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf85,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_b38);
  std::__cxx11::string::~string((string *)&local_b58);
  std::allocator<char>::~allocator(&local_b59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ba0,"(close-input-port my_file)",&local_ba1);
  compile_fixture::run(&local_b80,&this->super_compile_fixture,&local_ba0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("-1",&local_b80,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf86,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_b80);
  std::__cxx11::string::~string((string *)&local_ba0);
  std::allocator<char>::~allocator(&local_ba1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_be8,
             "(set! my_file (let ([fh (open-file \"out.txt\" #t)])(make-port #t \"out.txt\" fh (make-string 3) 3 3)))"
             ,&local_be9);
  compile_fixture::run(&local_bc8,&this->super_compile_fixture,&local_be8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("<port>: \"out.txt\"",&local_bc8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf88,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_bc8);
  std::__cxx11::string::~string((string *)&local_be8);
  std::allocator<char>::~allocator(&local_be9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c30,"(%slot-ref my_file 5)",&local_c31);
  compile_fixture::run(&local_c10,&this->super_compile_fixture,&local_c30,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_c10,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf89,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_c10);
  std::__cxx11::string::~string((string *)&local_c30);
  std::allocator<char>::~allocator(&local_c31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c78,"(input-port? my_file)",&local_c79);
  compile_fixture::run(&local_c58,&this->super_compile_fixture,&local_c78,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_c58,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf8a,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_c58);
  std::__cxx11::string::~string((string *)&local_c78);
  std::allocator<char>::~allocator(&local_c79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_cc0,"(read-char my_file)",&local_cc1);
  compile_fixture::run(&local_ca0,&this->super_compile_fixture,&local_cc0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#\\o",&local_ca0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf8b,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_ca0);
  std::__cxx11::string::~string((string *)&local_cc0);
  std::allocator<char>::~allocator(&local_cc1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d08,"(peek-char my_file)",&local_d09);
  compile_fixture::run(&local_ce8,&this->super_compile_fixture,&local_d08,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#\\u",&local_ce8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf8c,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_ce8);
  std::__cxx11::string::~string((string *)&local_d08);
  std::allocator<char>::~allocator(&local_d09);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d50,"(peek-char my_file)",&local_d51);
  compile_fixture::run(&local_d30,&this->super_compile_fixture,&local_d50,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#\\u",&local_d30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf8d,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_d30);
  std::__cxx11::string::~string((string *)&local_d50);
  std::allocator<char>::~allocator(&local_d51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d98,"(read-char my_file)",&local_d99);
  compile_fixture::run(&local_d78,&this->super_compile_fixture,&local_d98,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#\\u",&local_d78,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf8e,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_d78);
  std::__cxx11::string::~string((string *)&local_d98);
  std::allocator<char>::~allocator(&local_d99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_de0,"(peek-char my_file)",&local_de1);
  compile_fixture::run(&local_dc0,&this->super_compile_fixture,&local_de0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#\\t",&local_dc0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf8f,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_dc0);
  std::__cxx11::string::~string((string *)&local_de0);
  std::allocator<char>::~allocator(&local_de1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e28,"(read-char my_file)",&local_e29);
  compile_fixture::run(&local_e08,&this->super_compile_fixture,&local_e28,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#\\t",&local_e08,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf90,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_e08);
  std::__cxx11::string::~string((string *)&local_e28);
  std::allocator<char>::~allocator(&local_e29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e70,"(peek-char my_file)",&local_e71);
  compile_fixture::run(&local_e50,&this->super_compile_fixture,&local_e70,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#\\p",&local_e50,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf91,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_e50);
  std::__cxx11::string::~string((string *)&local_e70);
  std::allocator<char>::~allocator(&local_e71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_eb8,"(read-char my_file)",&local_eb9);
  compile_fixture::run(&local_e98,&this->super_compile_fixture,&local_eb8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#\\p",&local_e98,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf92,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_e98);
  std::__cxx11::string::~string((string *)&local_eb8);
  std::allocator<char>::~allocator(&local_eb9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f00,"(peek-char my_file)",&local_f01);
  compile_fixture::run(&local_ee0,&this->super_compile_fixture,&local_f00,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#\\u",&local_ee0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf93,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_ee0);
  std::__cxx11::string::~string((string *)&local_f00);
  std::allocator<char>::~allocator(&local_f01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f48,"(read-char my_file)",&local_f49);
  compile_fixture::run(&local_f28,&this->super_compile_fixture,&local_f48,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#\\u",&local_f28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf94,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_f28);
  std::__cxx11::string::~string((string *)&local_f48);
  std::allocator<char>::~allocator(&local_f49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f90,"(peek-char my_file)",&local_f91);
  compile_fixture::run(&local_f70,&this->super_compile_fixture,&local_f90,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#\\t",&local_f70,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf95,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_f70);
  std::__cxx11::string::~string((string *)&local_f90);
  std::allocator<char>::~allocator(&local_f91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_fd8,"(read-char my_file)",&local_fd9);
  compile_fixture::run(&local_fb8,&this->super_compile_fixture,&local_fd8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#\\t",&local_fb8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf96,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_fb8);
  std::__cxx11::string::~string((string *)&local_fd8);
  std::allocator<char>::~allocator(&local_fd9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1020,"(peek-char my_file)",&local_1021);
  compile_fixture::run(&local_1000,&this->super_compile_fixture,&local_1020,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#eof",&local_1000,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf97,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_1000);
  std::__cxx11::string::~string((string *)&local_1020);
  std::allocator<char>::~allocator(&local_1021);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1068,"(read-char my_file)",&local_1069);
  compile_fixture::run(&local_1048,&this->super_compile_fixture,&local_1068,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#eof",&local_1048,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf98,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_1048);
  std::__cxx11::string::~string((string *)&local_1068);
  std::allocator<char>::~allocator(&local_1069);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_10b0,"(read-char my_file)",&local_10b1);
  compile_fixture::run(&local_1090,&this->super_compile_fixture,&local_10b0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#eof",&local_1090,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf99,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_1090);
  std::__cxx11::string::~string((string *)&local_10b0);
  std::allocator<char>::~allocator(&local_10b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_10f8,"(eof-object? (read-char my_file))",&local_10f9);
  compile_fixture::run(&local_10d8,&this->super_compile_fixture,&local_10f8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_10d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf9a,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_10d8);
  std::__cxx11::string::~string((string *)&local_10f8);
  std::allocator<char>::~allocator(&local_10f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1140,"(close-input-port my_file)",&local_1141);
  compile_fixture::run(&local_1120,&this->super_compile_fixture,&local_1140,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("0",&local_1120,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf9b,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_1120);
  std::__cxx11::string::~string((string *)&local_1140);
  std::allocator<char>::~allocator(&local_1141);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1188,"(eof-object? 3)",&local_1189);
  compile_fixture::run(&local_1168,&this->super_compile_fixture,&local_1188,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_1168,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf9c,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_1168);
  std::__cxx11::string::~string((string *)&local_1188);
  std::allocator<char>::~allocator(&local_1189);
  return;
}

Assistant:

void test()
      {
      build_libs();
      TEST_EQ("#t", run("(port? standard-input-port)"));
      TEST_EQ("#t", run("(input-port? standard-input-port)"));
      TEST_EQ("#f", run("(output-port? standard-input-port)"));
      TEST_EQ("#t", run("(port? standard-output-port)"));
      TEST_EQ("#f", run("(input-port? standard-output-port)"));
      TEST_EQ("#t", run("(output-port? standard-output-port)"));
      TEST_EQ("#t", run("(port? standard-error-port)"));
      TEST_EQ("#f", run("(input-port? standard-error-port)"));
      TEST_EQ("#t", run("(output-port? standard-error-port)"));

      TEST_EQ("<port>: \"altout\"", run("(define alternative-output-port (make-port #f \"altout\" 1 (make-string 1024) 0 1024))"));

      TEST_EQ("<port>: \"stdout\"", run("(current-output-port)"));
      TEST_EQ("<port>: \"altout\"", run("(current-output-port alternative-output-port)"));
      TEST_EQ("<port>: \"altout\"", run("(current-output-port)"));
      TEST_EQ("<port>: \"stdin\"", run("(current-input-port)"));
      TEST_EQ("<port>: \"stderr\"", run("(current-error-port)"));

      TEST_EQ("", run("(write-char #\\f)(write-char #\\l)(write-char #\\u)(write-char #\\s)(write-char #\\h)(write-char #\\010)"));
      TEST_EQ("", run("(flush-output-port)"));

      TEST_EQ("3", run("(open-file \"out.txt\" #f)"));
      TEST_EQ("0", run("(close-file 3)"));

      TEST_EQ("<port>: \"out.txt\"", run("(define my_file (open-output-file \"out.txt\"))"));
      TEST_EQ("3", run("(%slot-ref my_file 2)")); // gets file handle id
      TEST_EQ("", run("(write-char #\\o my_file)"));
      TEST_EQ("", run("(write-char #\\u my_file)"));
      TEST_EQ("", run("(write-char #\\t my_file)"));
      TEST_EQ("", run("(write-char #\\p my_file)"));
      TEST_EQ("", run("(write-char #\\u my_file)"));
      TEST_EQ("", run("(write-char #\\t my_file)"));
      TEST_EQ("0", run("(close-output-port my_file)"));
      TEST_EQ("-1", run("(close-output-port my_file)"));

      TEST_EQ("<port>: \"out.txt\"", run("(define my_file (open-input-file \"out.txt\"))"));
      TEST_EQ("#t", run("(input-port? my_file)"));
      TEST_EQ("#\\o", run("(read-char my_file)"));
      TEST_EQ("#\\u", run("(read-char my_file)"));
      TEST_EQ("#\\t", run("(read-char my_file)"));
      TEST_EQ("#\\p", run("(read-char my_file)"));
      TEST_EQ("#\\u", run("(read-char my_file)"));
      TEST_EQ("#\\t", run("(read-char my_file)"));
      TEST_EQ("#eof", run("(read-char my_file)"));
      TEST_EQ("#eof", run("(read-char my_file)"));
      TEST_EQ("0", run("(close-input-port my_file)"));
      TEST_EQ("-1", run("(close-input-port my_file)"));

      TEST_EQ("<port>: \"out.txt\"", run("(set! my_file (let ([fh (open-file \"out.txt\" #t)])(make-port #t \"out.txt\" fh (make-string 3) 3 3)))"));
      TEST_EQ("3", run("(%slot-ref my_file 5)")); // size of buffer
      TEST_EQ("#t", run("(input-port? my_file)"));
      TEST_EQ("#\\o", run("(read-char my_file)"));
      TEST_EQ("#\\u", run("(peek-char my_file)"));
      TEST_EQ("#\\u", run("(peek-char my_file)"));
      TEST_EQ("#\\u", run("(read-char my_file)"));
      TEST_EQ("#\\t", run("(peek-char my_file)"));
      TEST_EQ("#\\t", run("(read-char my_file)"));
      TEST_EQ("#\\p", run("(peek-char my_file)"));
      TEST_EQ("#\\p", run("(read-char my_file)"));
      TEST_EQ("#\\u", run("(peek-char my_file)"));
      TEST_EQ("#\\u", run("(read-char my_file)"));
      TEST_EQ("#\\t", run("(peek-char my_file)"));
      TEST_EQ("#\\t", run("(read-char my_file)"));
      TEST_EQ("#eof", run("(peek-char my_file)"));
      TEST_EQ("#eof", run("(read-char my_file)"));
      TEST_EQ("#eof", run("(read-char my_file)"));
      TEST_EQ("#t", run("(eof-object? (read-char my_file))"));
      TEST_EQ("0", run("(close-input-port my_file)"));
      TEST_EQ("#f", run("(eof-object? 3)"));
      }